

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O2

longdouble * strtold_s(longdouble *__return_storage_ptr__,char *nptr,char **endptr)

{
  longdouble *plVar1;
  FLOAT_STRING_TYPE FVar2;
  longdouble *in_RAX;
  longdouble *plVar3;
  longdouble *extraout_RAX;
  int signal;
  char *runner;
  int exponential;
  double fraction;
  int local_4c;
  longdouble local_48;
  longdouble *local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24 [3];
  double local_18;
  
  local_4c = 1;
  plVar1 = __return_storage_ptr__;
  if (__return_storage_ptr__ == (longdouble *)0x0) goto switchD_00164897_caseD_1;
  local_38 = __return_storage_ptr__;
  FVar2 = splitFloatString((char *)__return_storage_ptr__,(char **)&local_38,&local_4c,&local_18,
                           local_24);
  plVar3 = (longdouble *)(ulong)(FVar2 - FST_INFINITY);
  in_RAX = plVar3;
  plVar1 = __return_storage_ptr__;
  if (3 < FVar2 - FST_INFINITY) goto switchD_00164897_caseD_1;
  in_RAX = (longdouble *)
           ((long)&switchD_00164897::switchdataD_00192800 +
           (long)(int)(&switchD_00164897::switchdataD_00192800)[(long)plVar3]);
  plVar1 = local_38;
  switch(plVar3) {
  case (longdouble *)0x0:
    local_30 = local_4c;
    local_48 = (longdouble)local_4c * (longdouble)INFINITY;
    in_RAX = (longdouble *)__errno_location();
    *(int *)in_RAX = 0;
    plVar1 = local_38;
  case (longdouble *)0x1:
    goto switchD_00164897_caseD_1;
  case (longdouble *)0x2:
    if (((local_24[0] != 0x134) || (local_18 <= 1.7976931348623157)) &&
       ((local_24[0] != -0x134 || (local_18 <= 2.2250738585072014)))) {
      local_48 = (longdouble)CONCAT28(local_48._8_2_,local_18);
      pow(10.0,(double)local_24[0]);
      in_RAX = extraout_RAX;
      plVar1 = local_38;
      goto switchD_00164897_caseD_1;
    }
    local_2c = local_4c;
    break;
  case (longdouble *)0x3:
    local_28 = local_4c;
  }
  local_48 = (longdouble)local_4c * (longdouble)INFINITY;
  in_RAX = (longdouble *)__errno_location();
  *(int *)in_RAX = 0x22;
  plVar1 = local_38;
switchD_00164897_caseD_1:
  local_38 = plVar1;
  if (nptr != (char *)0x0) {
    *(longdouble **)nptr = local_38;
    in_RAX = local_38;
  }
  return in_RAX;
}

Assistant:

long double strtold_s(const char* nptr, char** endptr)
{
    int signal = 1;
    double fraction;
    int exponential;
    char* runner = (char*)nptr;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_031: [If no conversion could be performed, the strtold_s returns the value 0.0.]*/
    long double result = 0.0;

    /*Codes_SRS_CRT_ABSTRACTIONS_21_037: [If the nptr is NULL, the strtold_s must not perform any conversion and must returns 0.0; endptr must receive NULL, provided that endptr is not a NULL pointer.]*/
    if (nptr != NULL)
    {
        switch (splitFloatString(nptr, &runner, &signal, &fraction, &exponential))
        {
        case FST_INFINITY:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_033: [If the string is 'INF' of 'INFINITY' (ignoring case), the strtold_s must return the INFINITY value for long double.]*/
            result = (long double)INFINITY * (long double)(signal);
            errno = 0;
            break;
        case FST_NAN:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_034: [If the string is 'NAN' or 'NAN(...)' (ignoring case), the strtold_s must return 0.0 and points endptr to the first character after the 'NAN' sequence.]*/
#ifdef _MSC_VER
#pragma warning(disable:26451) // warning C26451: overflow in constant arithmetic
#endif
            result = (long double)NAN;
#ifdef _MSC_VER
#pragma warning (default:26451)
#endif
            break;
        case FST_NUMBER:
            if ((exponential != DBL_MAX_10_EXP || (fraction <= 1.7976931348623158)) &&
                (exponential != (DBL_MAX_10_EXP * (-1)) || (fraction <= 2.2250738585072014)))
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_026: [The strtold_s must return the long double that represents the value in the initial part of the string. If any.]*/
                result = fraction * pow(10.0, (double)exponential) * (double)signal;
            }
            else
            {
                /*Codes_SRS_CRT_ABSTRACTIONS_21_032: [If the correct value is outside the range, the strtold_s returns the value plus or minus HUGE_VALL, and errno will receive the value ERANGE.]*/
                result = (long double)HUGE_VALF * (long double)(signal);
                errno = ERANGE;
            }
            break;
        case FST_OVERFLOW:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_032: [If the correct value is outside the range, the strtold_s returns the value plus or minus HUGE_VALL, and errno will receive the value ERANGE.]*/
            result = (long double)HUGE_VALF * (long double)(signal);
            errno = ERANGE;
            break;
        default:
            /*Codes_SRS_CRT_ABSTRACTIONS_21_030: [If the subject sequence is empty or does not have the expected form, the strtold_s must not perform any conversion and must returns 0.0; the value of nptr is stored in the object pointed to by endptr, provided that endptr is not a NULL pointer.]*/
            runner = (char*)nptr;
            break;
        }
    }

    /*Codes_SRS_CRT_ABSTRACTIONS_21_027: [The strtold_s must return in endptr a final string of one or more unrecognized characters, including the terminating null character of the input string.]*/
    if (endptr != NULL)
    {
        (*endptr) = runner;
    }

    return result;
}